

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O0

bool __thiscall cmCTestCVS::LogParser::ProcessLine(LogParser *this)

{
  bool bVar1;
  ulong uVar2;
  string local_70;
  string local_50;
  string local_30;
  LogParser *local_10;
  LogParser *this_local;
  
  local_10 = this;
  bVar1 = std::operator==(&(this->super_LineParser).Line,
                          "============================================================================="
                         );
  if (bVar1) {
    if (this->Section == SectionRevisions) {
      FinishRevision(this);
    }
    this->Section = SectionEnd;
  }
  else {
    bVar1 = std::operator==(&(this->super_LineParser).Line,"----------------------------");
    if (bVar1) {
      if (this->Section == SectionHeader) {
        this->Section = SectionRevisions;
      }
      else if (this->Section == SectionRevisions) {
        FinishRevision(this);
      }
    }
    else if (this->Section == SectionRevisions) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::operator+=
                  ((string *)&(this->Rev).Log,(string *)&(this->super_LineParser).Line);
        std::__cxx11::string::operator+=((string *)&(this->Rev).Log,"\n");
      }
      else {
        uVar2 = std::__cxx11::string::empty();
        if (((uVar2 & 1) == 0) ||
           (bVar1 = cmsys::RegularExpression::find
                              (&this->RegexRevision,&(this->super_LineParser).Line), !bVar1)) {
          uVar2 = std::__cxx11::string::empty();
          if (((uVar2 & 1) == 0) ||
             (bVar1 = cmsys::RegularExpression::find
                                (&this->RegexPerson,&(this->super_LineParser).Line), !bVar1)) {
            bVar1 = cmsys::RegularExpression::find
                              (&this->RegexBranches,&(this->super_LineParser).Line);
            if (!bVar1) {
              std::__cxx11::string::operator+=
                        ((string *)&(this->Rev).Log,(string *)&(this->super_LineParser).Line);
              std::__cxx11::string::operator+=((string *)&(this->Rev).Log,"\n");
            }
          }
          else {
            cmsys::RegularExpression::match_abi_cxx11_(&local_50,&this->RegexPerson,1);
            std::__cxx11::string::operator=((string *)&(this->Rev).Date,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            cmsys::RegularExpression::match_abi_cxx11_(&local_70,&this->RegexPerson,2);
            std::__cxx11::string::operator=((string *)&(this->Rev).Author,(string *)&local_70);
            std::__cxx11::string::~string((string *)&local_70);
          }
        }
        else {
          cmsys::RegularExpression::match_abi_cxx11_(&local_30,&this->RegexRevision,1);
          std::__cxx11::string::operator=((string *)&this->Rev,(string *)&local_30);
          std::__cxx11::string::~string((string *)&local_30);
        }
      }
    }
  }
  return this->Section != SectionEnd;
}

Assistant:

bool ProcessLine() CM_OVERRIDE
  {
    if (this->Line == ("======================================="
                       "======================================")) {
      // This line ends the revision list.
      if (this->Section == SectionRevisions) {
        this->FinishRevision();
      }
      this->Section = SectionEnd;
    } else if (this->Line == "----------------------------") {
      // This line divides revisions from the header and each other.
      if (this->Section == SectionHeader) {
        this->Section = SectionRevisions;
      } else if (this->Section == SectionRevisions) {
        this->FinishRevision();
      }
    } else if (this->Section == SectionRevisions) {
      if (!this->Rev.Log.empty()) {
        // Continue the existing log.
        this->Rev.Log += this->Line;
        this->Rev.Log += "\n";
      } else if (this->Rev.Rev.empty() &&
                 this->RegexRevision.find(this->Line)) {
        this->Rev.Rev = this->RegexRevision.match(1);
      } else if (this->Rev.Date.empty() &&
                 this->RegexPerson.find(this->Line)) {
        this->Rev.Date = this->RegexPerson.match(1);
        this->Rev.Author = this->RegexPerson.match(2);
      } else if (!this->RegexBranches.find(this->Line)) {
        // Start the log.
        this->Rev.Log += this->Line;
        this->Rev.Log += "\n";
      }
    }
    return this->Section != SectionEnd;
  }